

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,string *key)

{
  uint8_t *buffer;
  size_t sVar1;
  ByteData local_38;
  
  buffer = (uint8_t *)(key->_M_dataplus)._M_p;
  sVar1 = strlen((char *)buffer);
  ByteData::ByteData(&local_38,buffer,(uint32_t)sVar1);
  CreateRecordKey(__return_storage_ptr__,type,&local_38);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const std::string &key) {
  return CreateRecordKey(
      type, ByteData(
                reinterpret_cast<const uint8_t *>(key.data()),
                static_cast<uint32_t>(strlen(key.c_str()))));
}